

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

UnpackedStructType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::UnpackedStructType,slang::ast::Compilation&,slang::SourceLocation,slang::ast::ASTContext_const&>
          (BumpAllocator *this,Compilation *args,SourceLocation *args_1,ASTContext *args_2)

{
  UnpackedStructType *this_00;
  
  this_00 = (UnpackedStructType *)allocate(this,0xa8,8);
  ast::UnpackedStructType::UnpackedStructType(this_00,args,*args_1,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }